

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O2

bool __thiscall Screen::endAnimation(Screen *this)

{
  string local_30;
  
  wclear(this->animationScreen);
  wrefresh(this->animationScreen);
  delwin(this->animationScreen);
  this->animationMode = false;
  updateInfo(this);
  std::__cxx11::string::string((string *)&local_30,(string *)&this->currentText);
  displayText(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return true;
}

Assistant:

bool Screen::endAnimation() {
    // Clear out the window's data structure
    wclear(animationScreen);
    wrefresh(animationScreen);

    // Delete the window
    delwin(animationScreen);

    // Turn off animation mode
    animationMode = false;

    // Replace the screen contents
    updateInfo();

    displayText(currentText);

    return true;
}